

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

void swap_nifti_header(nifti_1_header *h,int is_nifti)

{
  ushort *puVar1;
  short *psVar2;
  float *pfVar3;
  char *pcVar4;
  undefined1 uVar5;
  char cVar6;
  int iVar7;
  short sVar8;
  size_t ii;
  long lVar9;
  
  if (is_nifti != 0) {
    iVar7 = h->sizeof_hdr;
    *(undefined1 *)&h->sizeof_hdr = *(undefined1 *)((long)&h->sizeof_hdr + 3);
    *(char *)((long)&h->sizeof_hdr + 3) = (char)iVar7;
    puVar1 = (ushort *)((long)&h->sizeof_hdr + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    iVar7 = h->extents;
    *(undefined1 *)&h->extents = *(undefined1 *)((long)&h->extents + 3);
    *(char *)((long)&h->extents + 3) = (char)iVar7;
    puVar1 = (ushort *)((long)&h->extents + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    psVar2 = &h->session_error;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    lVar9 = 0;
    do {
      psVar2 = h->dim + lVar9;
      *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    uVar5 = *(undefined1 *)&h->intent_p1;
    *(undefined1 *)&h->intent_p1 = *(undefined1 *)((long)&h->intent_p1 + 3);
    *(undefined1 *)((long)&h->intent_p1 + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->intent_p1 + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->intent_p2;
    *(undefined1 *)&h->intent_p2 = *(undefined1 *)((long)&h->intent_p2 + 3);
    *(undefined1 *)((long)&h->intent_p2 + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->intent_p2 + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->intent_p3;
    *(undefined1 *)&h->intent_p3 = *(undefined1 *)((long)&h->intent_p3 + 3);
    *(undefined1 *)((long)&h->intent_p3 + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->intent_p3 + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    psVar2 = &h->intent_code;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    psVar2 = &h->datatype;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    psVar2 = &h->bitpix;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    psVar2 = &h->slice_start;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    lVar9 = 0;
    do {
      uVar5 = *(undefined1 *)(h->pixdim + lVar9);
      *(undefined1 *)(h->pixdim + lVar9) = *(undefined1 *)((long)h->pixdim + lVar9 * 4 + 3);
      *(undefined1 *)((long)h->pixdim + lVar9 * 4 + 3) = uVar5;
      puVar1 = (ushort *)((long)h->pixdim + lVar9 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    uVar5 = *(undefined1 *)&h->vox_offset;
    *(undefined1 *)&h->vox_offset = *(undefined1 *)((long)&h->vox_offset + 3);
    *(undefined1 *)((long)&h->vox_offset + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->vox_offset + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->scl_slope;
    *(undefined1 *)&h->scl_slope = *(undefined1 *)((long)&h->scl_slope + 3);
    *(undefined1 *)((long)&h->scl_slope + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->scl_slope + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->scl_inter;
    *(undefined1 *)&h->scl_inter = *(undefined1 *)((long)&h->scl_inter + 3);
    *(undefined1 *)((long)&h->scl_inter + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->scl_inter + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    psVar2 = &h->slice_end;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    uVar5 = *(undefined1 *)&h->cal_max;
    *(undefined1 *)&h->cal_max = *(undefined1 *)((long)&h->cal_max + 3);
    *(undefined1 *)((long)&h->cal_max + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->cal_max + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->cal_min;
    *(undefined1 *)&h->cal_min = *(undefined1 *)((long)&h->cal_min + 3);
    *(undefined1 *)((long)&h->cal_min + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->cal_min + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->slice_duration;
    *(undefined1 *)&h->slice_duration = *(undefined1 *)((long)&h->slice_duration + 3);
    *(undefined1 *)((long)&h->slice_duration + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->slice_duration + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->toffset;
    *(undefined1 *)&h->toffset = *(undefined1 *)((long)&h->toffset + 3);
    *(undefined1 *)((long)&h->toffset + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->toffset + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    iVar7 = h->glmax;
    *(undefined1 *)&h->glmax = *(undefined1 *)((long)&h->glmax + 3);
    *(char *)((long)&h->glmax + 3) = (char)iVar7;
    puVar1 = (ushort *)((long)&h->glmax + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    iVar7 = h->glmin;
    *(undefined1 *)&h->glmin = *(undefined1 *)((long)&h->glmin + 3);
    *(char *)((long)&h->glmin + 3) = (char)iVar7;
    puVar1 = (ushort *)((long)&h->glmin + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    psVar2 = &h->qform_code;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    psVar2 = &h->sform_code;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    uVar5 = *(undefined1 *)&h->quatern_b;
    *(undefined1 *)&h->quatern_b = *(undefined1 *)((long)&h->quatern_b + 3);
    *(undefined1 *)((long)&h->quatern_b + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->quatern_b + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->quatern_c;
    *(undefined1 *)&h->quatern_c = *(undefined1 *)((long)&h->quatern_c + 3);
    *(undefined1 *)((long)&h->quatern_c + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->quatern_c + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->quatern_d;
    *(undefined1 *)&h->quatern_d = *(undefined1 *)((long)&h->quatern_d + 3);
    *(undefined1 *)((long)&h->quatern_d + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->quatern_d + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->qoffset_x;
    *(undefined1 *)&h->qoffset_x = *(undefined1 *)((long)&h->qoffset_x + 3);
    *(undefined1 *)((long)&h->qoffset_x + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->qoffset_x + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->qoffset_y;
    *(undefined1 *)&h->qoffset_y = *(undefined1 *)((long)&h->qoffset_y + 3);
    *(undefined1 *)((long)&h->qoffset_y + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->qoffset_y + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->qoffset_z;
    *(undefined1 *)&h->qoffset_z = *(undefined1 *)((long)&h->qoffset_z + 3);
    *(undefined1 *)((long)&h->qoffset_z + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->qoffset_z + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    lVar9 = 0;
    do {
      uVar5 = *(undefined1 *)(h->srow_x + lVar9);
      *(undefined1 *)(h->srow_x + lVar9) = *(undefined1 *)((long)h->srow_x + lVar9 * 4 + 3);
      *(undefined1 *)((long)h->srow_x + lVar9 * 4 + 3) = uVar5;
      puVar1 = (ushort *)((long)h->srow_x + lVar9 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar9 = 0;
    do {
      uVar5 = *(undefined1 *)(h->srow_y + lVar9);
      *(undefined1 *)(h->srow_y + lVar9) = *(undefined1 *)((long)h->srow_y + lVar9 * 4 + 3);
      *(undefined1 *)((long)h->srow_y + lVar9 * 4 + 3) = uVar5;
      puVar1 = (ushort *)((long)h->srow_y + lVar9 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar9 = 0;
    do {
      uVar5 = *(undefined1 *)(h->srow_z + lVar9);
      *(undefined1 *)(h->srow_z + lVar9) = *(undefined1 *)((long)h->srow_z + lVar9 * 4 + 3);
      *(undefined1 *)((long)h->srow_z + lVar9 * 4 + 3) = uVar5;
      puVar1 = (ushort *)((long)h->srow_z + lVar9 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    return;
  }
  if (h != (nifti_1_header *)0x0) {
    iVar7 = h->sizeof_hdr;
    *(undefined1 *)&h->sizeof_hdr = *(undefined1 *)((long)&h->sizeof_hdr + 3);
    *(char *)((long)&h->sizeof_hdr + 3) = (char)iVar7;
    puVar1 = (ushort *)((long)&h->sizeof_hdr + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    iVar7 = h->extents;
    *(undefined1 *)&h->extents = *(undefined1 *)((long)&h->extents + 3);
    *(char *)((long)&h->extents + 3) = (char)iVar7;
    puVar1 = (ushort *)((long)&h->extents + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    psVar2 = &h->session_error;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    lVar9 = 0;
    do {
      psVar2 = h->dim + lVar9;
      *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    pfVar3 = &h->intent_p1;
    *(ushort *)pfVar3 = *(short *)pfVar3 << 8 | *(ushort *)pfVar3 >> 8;
    puVar1 = (ushort *)((long)&h->intent_p1 + 2);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    pfVar3 = &h->intent_p2;
    *(ushort *)pfVar3 = *(short *)pfVar3 << 8 | *(ushort *)pfVar3 >> 8;
    puVar1 = (ushort *)((long)&h->intent_p2 + 2);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    pfVar3 = &h->intent_p3;
    *(ushort *)pfVar3 = *(short *)pfVar3 << 8 | *(ushort *)pfVar3 >> 8;
    puVar1 = (ushort *)((long)&h->intent_p3 + 2);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    psVar2 = &h->intent_code;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    psVar2 = &h->datatype;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    psVar2 = &h->bitpix;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    psVar2 = &h->slice_start;
    *psVar2 = *psVar2 << 8 | (ushort)*psVar2 >> 8;
    lVar9 = 0;
    do {
      uVar5 = *(undefined1 *)(h->pixdim + lVar9);
      *(undefined1 *)(h->pixdim + lVar9) = *(undefined1 *)((long)h->pixdim + lVar9 * 4 + 3);
      *(undefined1 *)((long)h->pixdim + lVar9 * 4 + 3) = uVar5;
      puVar1 = (ushort *)((long)h->pixdim + lVar9 * 4 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    uVar5 = *(undefined1 *)&h->vox_offset;
    *(undefined1 *)&h->vox_offset = *(undefined1 *)((long)&h->vox_offset + 3);
    *(undefined1 *)((long)&h->vox_offset + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->vox_offset + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->scl_slope;
    *(undefined1 *)&h->scl_slope = *(undefined1 *)((long)&h->scl_slope + 3);
    *(undefined1 *)((long)&h->scl_slope + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->scl_slope + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->scl_inter;
    *(undefined1 *)&h->scl_inter = *(undefined1 *)((long)&h->scl_inter + 3);
    *(undefined1 *)((long)&h->scl_inter + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->scl_inter + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    sVar8 = h->slice_end;
    *(char *)&h->slice_end = h->xyzt_units;
    h->xyzt_units = (char)sVar8;
    puVar1 = (ushort *)((long)&h->slice_end + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->cal_max;
    *(undefined1 *)&h->cal_max = *(undefined1 *)((long)&h->cal_max + 3);
    *(undefined1 *)((long)&h->cal_max + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->cal_max + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->cal_min;
    *(undefined1 *)&h->cal_min = *(undefined1 *)((long)&h->cal_min + 3);
    *(undefined1 *)((long)&h->cal_min + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->cal_min + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->slice_duration;
    *(undefined1 *)&h->slice_duration = *(undefined1 *)((long)&h->slice_duration + 3);
    *(undefined1 *)((long)&h->slice_duration + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->slice_duration + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)&h->toffset;
    *(undefined1 *)&h->toffset = *(undefined1 *)((long)&h->toffset + 3);
    *(undefined1 *)((long)&h->toffset + 3) = uVar5;
    puVar1 = (ushort *)((long)&h->toffset + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    iVar7 = h->glmax;
    *(undefined1 *)&h->glmax = *(undefined1 *)((long)&h->glmax + 3);
    *(char *)((long)&h->glmax + 3) = (char)iVar7;
    puVar1 = (ushort *)((long)&h->glmax + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    iVar7 = h->glmin;
    *(undefined1 *)&h->glmin = *(undefined1 *)((long)&h->glmin + 3);
    *(char *)((long)&h->glmin + 3) = (char)iVar7;
    puVar1 = (ushort *)((long)&h->glmin + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)(h->srow_z + 1);
    *(undefined1 *)(h->srow_z + 1) = *(undefined1 *)((long)h->srow_z + 7);
    *(undefined1 *)((long)h->srow_z + 7) = uVar5;
    puVar1 = (ushort *)((long)h->srow_z + 5);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)(h->srow_z + 2);
    *(undefined1 *)(h->srow_z + 2) = *(undefined1 *)((long)h->srow_z + 0xb);
    *(undefined1 *)((long)h->srow_z + 0xb) = uVar5;
    puVar1 = (ushort *)((long)h->srow_z + 9);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar5 = *(undefined1 *)(h->srow_z + 3);
    *(undefined1 *)(h->srow_z + 3) = *(undefined1 *)((long)h->srow_z + 0xf);
    *(undefined1 *)((long)h->srow_z + 0xf) = uVar5;
    puVar1 = (ushort *)((long)h->srow_z + 0xd);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    cVar6 = h->intent_name[0];
    h->intent_name[0] = h->intent_name[3];
    h->intent_name[3] = cVar6;
    pcVar4 = h->intent_name + 1;
    *(ushort *)pcVar4 = *(ushort *)pcVar4 << 8 | *(ushort *)pcVar4 >> 8;
    cVar6 = h->intent_name[4];
    h->intent_name[4] = h->intent_name[7];
    h->intent_name[7] = cVar6;
    pcVar4 = h->intent_name + 5;
    *(ushort *)pcVar4 = *(ushort *)pcVar4 << 8 | *(ushort *)pcVar4 >> 8;
    cVar6 = h->intent_name[8];
    h->intent_name[8] = h->intent_name[0xb];
    h->intent_name[0xb] = cVar6;
    pcVar4 = h->intent_name + 9;
    *(ushort *)pcVar4 = *(ushort *)pcVar4 << 8 | *(ushort *)pcVar4 >> 8;
    cVar6 = h->intent_name[0xc];
    h->intent_name[0xc] = h->intent_name[0xf];
    h->intent_name[0xf] = cVar6;
    pcVar4 = h->intent_name + 0xd;
    *(ushort *)pcVar4 = *(ushort *)pcVar4 << 8 | *(ushort *)pcVar4 >> 8;
    cVar6 = h->magic[0];
    h->magic[0] = h->magic[3];
    h->magic[3] = cVar6;
    pcVar4 = h->magic + 1;
    *(ushort *)pcVar4 = *(ushort *)pcVar4 << 8 | *(ushort *)pcVar4 >> 8;
    return;
  }
  return;
}

Assistant:

void swap_nifti_header( struct nifti_1_header *h , int is_nifti )
{

   /* if ANALYZE, swap as such and return */
   if( ! is_nifti ) {
      nifti_swap_as_analyze((nifti_analyze75 *)h);
      return;
   }

   /* otherwise, swap all NIFTI fields */

   nifti_swap_4bytes(1, &h->sizeof_hdr);
   nifti_swap_4bytes(1, &h->extents);
   nifti_swap_2bytes(1, &h->session_error);

   nifti_swap_2bytes(8, h->dim);
   nifti_swap_4bytes(1, &h->intent_p1);
   nifti_swap_4bytes(1, &h->intent_p2);
   nifti_swap_4bytes(1, &h->intent_p3);

   nifti_swap_2bytes(1, &h->intent_code);
   nifti_swap_2bytes(1, &h->datatype);
   nifti_swap_2bytes(1, &h->bitpix);
   nifti_swap_2bytes(1, &h->slice_start);

   nifti_swap_4bytes(8, h->pixdim);

   nifti_swap_4bytes(1, &h->vox_offset);
   nifti_swap_4bytes(1, &h->scl_slope);
   nifti_swap_4bytes(1, &h->scl_inter);
   nifti_swap_2bytes(1, &h->slice_end);

   nifti_swap_4bytes(1, &h->cal_max);
   nifti_swap_4bytes(1, &h->cal_min);
   nifti_swap_4bytes(1, &h->slice_duration);
   nifti_swap_4bytes(1, &h->toffset);
   nifti_swap_4bytes(1, &h->glmax);
   nifti_swap_4bytes(1, &h->glmin);

   nifti_swap_2bytes(1, &h->qform_code);
   nifti_swap_2bytes(1, &h->sform_code);

   nifti_swap_4bytes(1, &h->quatern_b);
   nifti_swap_4bytes(1, &h->quatern_c);
   nifti_swap_4bytes(1, &h->quatern_d);
   nifti_swap_4bytes(1, &h->qoffset_x);
   nifti_swap_4bytes(1, &h->qoffset_y);
   nifti_swap_4bytes(1, &h->qoffset_z);

   nifti_swap_4bytes(4, h->srow_x);
   nifti_swap_4bytes(4, h->srow_y);
   nifti_swap_4bytes(4, h->srow_z);

   return ;
}